

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  gzFile pgVar3;
  FILE *in_00;
  bool bVar4;
  FILE *in;
  char outmode [20];
  char *bname;
  gzFile file;
  int uncompr;
  int copyout;
  char **argv_local;
  int argc_local;
  
  snprintf((char *)&in,0x14,"%s","wb6 ");
  prog = *argv;
  register0x00000000 = strrchr(*argv,0x2f);
  if (register0x00000000 == (char *)0x0) {
    unique0x00012000 = *argv;
  }
  else {
    register0x00000000 = register0x00000000 + 1;
  }
  argv_local._0_4_ = argc + -1;
  _uncompr = argv + 1;
  iVar2 = strcmp(stack0xffffffffffffffd0,"gunzip");
  if (iVar2 == 0) {
    bVar4 = true;
    bVar1 = false;
  }
  else {
    iVar2 = strcmp(stack0xffffffffffffffd0,"zcat");
    bVar4 = iVar2 == 0;
    bVar1 = bVar4;
  }
  for (; 0 < (int)argv_local; argv_local._0_4_ = (int)argv_local + -1) {
    iVar2 = strcmp(*_uncompr,"-c");
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = strcmp(*_uncompr,"-d");
      if (iVar2 == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = strcmp(*_uncompr,"-f");
        if (iVar2 == 0) {
          in._3_1_ = 'f';
        }
        else {
          iVar2 = strcmp(*_uncompr,"-h");
          if (iVar2 == 0) {
            in._3_1_ = 'h';
          }
          else {
            iVar2 = strcmp(*_uncompr,"-r");
            if (iVar2 == 0) {
              in._3_1_ = 'R';
            }
            else {
              if ((((**_uncompr != '-') || ((*_uncompr)[1] < '1')) || ('9' < (*_uncompr)[1])) ||
                 ((*_uncompr)[2] != '\0')) break;
              in._2_1_ = (*_uncompr)[1];
            }
          }
        }
      }
    }
    _uncompr = _uncompr + 1;
  }
  if (in._3_1_ == ' ') {
    in._3_1_ = '\0';
  }
  if ((int)argv_local == 0) {
    if (bVar4) {
      iVar2 = fileno(_stdin);
      pgVar3 = (gzFile)gzdopen(iVar2,"rb");
      if (pgVar3 == (gzFile)0x0) {
        error("can\'t gzdopen stdin");
      }
      gz_uncompress(pgVar3,(FILE *)_stdout);
    }
    else {
      iVar2 = fileno(_stdout);
      pgVar3 = (gzFile)gzdopen(iVar2,&in);
      if (pgVar3 == (gzFile)0x0) {
        error("can\'t gzdopen stdout");
      }
      gz_compress((FILE *)_stdin,pgVar3);
    }
  }
  else {
    do {
      if (bVar4) {
        if (bVar1) {
          pgVar3 = (gzFile)gzopen(*_uncompr,"rb");
          if (pgVar3 == (gzFile)0x0) {
            fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,*_uncompr);
          }
          else {
            gz_uncompress(pgVar3,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(*_uncompr);
        }
      }
      else if (bVar1) {
        in_00 = fopen(*_uncompr,"rb");
        if (in_00 == (FILE *)0x0) {
          perror(*_uncompr);
        }
        else {
          iVar2 = fileno(_stdout);
          pgVar3 = (gzFile)gzdopen(iVar2,&in);
          if (pgVar3 == (gzFile)0x0) {
            error("can\'t gzdopen stdout");
          }
          gz_compress((FILE *)in_00,pgVar3);
        }
      }
      else {
        file_compress(*_uncompr,(char *)&in);
      }
      _uncompr = _uncompr + 1;
      argv_local._0_4_ = (int)argv_local + -1;
    } while ((int)argv_local != 0);
  }
  return 0;
}

Assistant:

int main(argc, argv)
    int argc;
    char *argv[];
{
    int copyout = 0;
    int uncompr = 0;
    gzFile file;
    char *bname, outmode[20];

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outmode, sizeof(outmode), "%s", "wb6 ");
#else
    strcpy(outmode, "wb6 ");
#endif

    prog = argv[0];
    bname = strrchr(argv[0], '/');
    if (bname)
      bname++;
    else
      bname = argv[0];
    argc--, argv++;

    if (!strcmp(bname, "gunzip"))
      uncompr = 1;
    else if (!strcmp(bname, "zcat"))
      copyout = uncompr = 1;

    while (argc > 0) {
      if (strcmp(*argv, "-c") == 0)
        copyout = 1;
      else if (strcmp(*argv, "-d") == 0)
        uncompr = 1;
      else if (strcmp(*argv, "-f") == 0)
        outmode[3] = 'f';
      else if (strcmp(*argv, "-h") == 0)
        outmode[3] = 'h';
      else if (strcmp(*argv, "-r") == 0)
        outmode[3] = 'R';
      else if ((*argv)[0] == '-' && (*argv)[1] >= '1' && (*argv)[1] <= '9' &&
               (*argv)[2] == 0)
        outmode[2] = (*argv)[1];
      else
        break;
      argc--, argv++;
    }
    if (outmode[3] == ' ')
        outmode[3] = 0;
    if (argc == 0) {
        SET_BINARY_MODE(stdin);
        SET_BINARY_MODE(stdout);
        if (uncompr) {
            file = gzdopen(fileno(stdin), "rb");
            if (file == NULL) error("can't gzdopen stdin");
            gz_uncompress(file, stdout);
        } else {
            file = gzdopen(fileno(stdout), outmode);
            if (file == NULL) error("can't gzdopen stdout");
            gz_compress(stdin, file);
        }
    } else {
        if (copyout) {
            SET_BINARY_MODE(stdout);
        }
        do {
            if (uncompr) {
                if (copyout) {
                    file = gzopen(*argv, "rb");
                    if (file == NULL)
                        fprintf(stderr, "%s: can't gzopen %s\n", prog, *argv);
                    else
                        gz_uncompress(file, stdout);
                } else {
                    file_uncompress(*argv);
                }
            } else {
                if (copyout) {
                    FILE * in = fopen(*argv, "rb");

                    if (in == NULL) {
                        perror(*argv);
                    } else {
                        file = gzdopen(fileno(stdout), outmode);
                        if (file == NULL) error("can't gzdopen stdout");

                        gz_compress(in, file);
                    }

                } else {
                    file_compress(*argv, outmode);
                }
            }
        } while (argv++, --argc);
    }
    return 0;
}